

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Register.cpp
# Opt level: O2

void __thiscall Register::Register(Register *this,RegisterKind kind,uint32_t num)

{
  uint __line;
  char *__assertion;
  
  this->id = (ushort)(kind << 8) | (ushort)num;
  if (kind < PCR) {
    if (num < 0x20) {
      return;
    }
    __assertion = "num < 32";
    __line = 0x65;
  }
  else if (kind == PCR) {
    if (num < 2) {
      return;
    }
    __assertion = "num < 2";
    __line = 0x68;
  }
  else {
    __assertion = "false";
    __line = 0x6b;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Disasm/Register.cpp"
                ,__line,"Register::Register(Reg::RegisterKind, uint32_t)");
}

Assistant:

Register::Register(Reg::RegisterKind kind, uint32_t num) {
  id = (kind << 8) | num;

  // check range:
  switch (kind) {
    case Reg::GPR:
    case Reg::FPR:
    case Reg::VF:
    case Reg::COP0:
    case Reg::VI:
      assert(num < 32);
      break;
    case Reg::PCR:
      assert(num < 2);
      break;
    default:
      assert(false);
  }
}